

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QGraphicsItemCache * __thiscall
QGraphicsItemPrivate::maybeExtraItemCache(QGraphicsItemPrivate *this)

{
  QGraphicsItemCache *pQVar1;
  long in_FS_OFFSET;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  extra(&QStack_38,this,ExtraCacheData);
  pQVar1 = (QGraphicsItemCache *)qvariant_cast<void*>(&QStack_38);
  ::QVariant::~QVariant(&QStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItemCache *QGraphicsItemPrivate::maybeExtraItemCache() const
{
    return (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
}